

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O3

mp_limb_t mpn_mul(mp_ptr rp,mp_srcptr up,mp_size_t un,mp_srcptr vp,mp_size_t vn)

{
  mp_limb_t mVar1;
  ulong uVar2;
  mp_ptr rp_00;
  mp_limb_t *pmVar3;
  
  if (un < vn) {
    __assert_fail("un >= vn",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vbirds[P]Bignumber/mini-gmp.c"
                  ,0x241,"mp_limb_t mpn_mul(mp_ptr, mp_srcptr, mp_size_t, mp_srcptr, mp_size_t)");
  }
  if (0 < vn) {
    mVar1 = mpn_mul_1(rp,up,un,*vp);
    rp[un] = mVar1;
    if (vn != 1) {
      uVar2 = vn + 1;
      pmVar3 = vp + 1;
      rp_00 = rp + 1;
      do {
        mVar1 = mpn_addmul_1(rp_00,up,un,*pmVar3);
        rp_00[un] = mVar1;
        uVar2 = uVar2 - 1;
        pmVar3 = pmVar3 + 1;
        rp_00 = rp_00 + 1;
      } while (2 < uVar2);
    }
    return mVar1;
  }
  __assert_fail("vn >= 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/vbirds[P]Bignumber/mini-gmp.c"
                ,0x242,"mp_limb_t mpn_mul(mp_ptr, mp_srcptr, mp_size_t, mp_srcptr, mp_size_t)");
}

Assistant:

mp_limb_t
mpn_mul (mp_ptr rp, mp_srcptr up, mp_size_t un, mp_srcptr vp, mp_size_t vn)
{
  assert (un >= vn);
  assert (vn >= 1);

  /* We first multiply by the low order limb. This result can be
     stored, not added, to rp. We also avoid a loop for zeroing this
     way. */

  rp[un] = mpn_mul_1 (rp, up, un, vp[0]);

  /* Now accumulate the product of up[] and the next higher limb from
     vp[]. */

  while (--vn >= 1)
    {
      rp += 1, vp += 1;
      rp[un] = mpn_addmul_1 (rp, up, un, vp[0]);
    }
  return rp[un];
}